

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O2

void __thiscall Regex::backtrackGroups(Regex *this,ParseData *data)

{
  int iVar1;
  GroupData *pGVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  uVar3 = (this->mGroups).mSize;
  lVar5 = 8;
  for (lVar6 = 0; lVar6 < (int)uVar3; lVar6 = lVar6 + 1) {
    pGVar2 = (this->mGroups).mData;
    iVar1 = *(int *)((long)pGVar2 + lVar5 + -4);
    iVar4 = iVar1 - data->cur_pos;
    if (iVar4 != 0 && data->cur_pos <= iVar1) {
      std::__cxx11::string::erase
                ((long)&pGVar2->start_pos + lVar5,
                 *(long *)((long)&(pGVar2->string)._M_dataplus._M_p + lVar5) - (long)iVar4);
      uVar3 = (this->mGroups).mSize;
      *(int *)((long)(this->mGroups).mData + lVar5 + -4) = data->cur_pos;
    }
    lVar5 = lVar5 + 0x28;
  }
  return;
}

Assistant:

void	Regex::backtrackGroups( ParseData *data )
{
	for ( int i = 0; i < (int)mGroups.size(); i++ )
	{
		if ( mGroups[ i ].end_pos > data->cur_pos )
		{
			std::string &s = mGroups[ i ].string;
			s.erase( s.length() - ( mGroups[ i ].end_pos - data->cur_pos ) );
			mGroups[ i ].end_pos = data->cur_pos;
		}
	}
}